

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::anon_unknown_14::XmlReporter::log_assert(XmlReporter *this,AssertData *rb)

{
  __pthread_internal_list *p_Var1;
  XmlWriter *pXVar2;
  char *pcVar3;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280 [32];
  undefined1 local_260 [16];
  string local_250;
  allocator<char> local_229;
  string local_228 [32];
  undefined1 local_208 [16];
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0 [32];
  undefined1 local_1b0 [16];
  string local_1a0;
  allocator<char> local_179;
  string local_178 [32];
  undefined1 local_158 [16];
  string local_148;
  allocator<char> local_121;
  string local_120 [32];
  undefined1 local_100 [16];
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  AssertData *rb_local;
  XmlReporter *this_local;
  
  if (((rb->m_failed & 1U) != 0) || ((this->opt->success & 1U) != 0)) {
    lock._M_device = (mutex_type *)rb;
    std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Expression",&local_41);
    pXVar2 = XmlWriter::startElement(&this->xml,&local_40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"success",&local_79);
    pXVar2 = XmlWriter::writeAttribute
                       (pXVar2,&local_78,
                        (bool)(~lock._M_device[1].super___mutex_base._M_mutex.__size[0] & 1));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"type",&local_a1);
    pcVar3 = assertString(((lock._M_device)->super___mutex_base)._M_mutex.__data.__owner);
    pXVar2 = XmlWriter::writeAttribute(pXVar2,&local_a0,pcVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"filename",&local_c9);
    pcVar3 = skipPathFromFilename
                       (*(char **)((long)&((lock._M_device)->super___mutex_base)._M_mutex + 0x10));
    pXVar2 = XmlWriter::writeAttribute(pXVar2,&local_c8,pcVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"line",(allocator<char> *)(local_100 + 0xf));
    local_100._8_4_ =
         line(this,*(uint *)((long)&((lock._M_device)->super___mutex_base)._M_mutex + 0x18));
    XmlWriter::writeAttribute<unsigned_int>(pXVar2,&local_f0,(uint *)(local_100 + 8));
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)(local_100 + 0xf));
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_120,"Original",&local_121);
    XmlWriter::scopedElement((XmlWriter *)local_100,(string *)&this->xml);
    p_Var1 = ((lock._M_device)->super___mutex_base)._M_mutex.__data.__list.__next;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,(char *)p_Var1,(allocator<char> *)(local_158 + 0xf));
    XmlWriter::ScopedElement::writeText((ScopedElement *)local_100,&local_148,true);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)(local_158 + 0xf));
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_100);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator(&local_121);
    if ((lock._M_device[1].super___mutex_base._M_mutex.__size[1] & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_178,"Exception",&local_179);
      XmlWriter::scopedElement((XmlWriter *)local_158,(string *)&this->xml);
      pcVar3 = String::c_str((String *)((long)&lock._M_device[1].super___mutex_base._M_mutex + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,pcVar3,(allocator<char> *)(local_1b0 + 0xf));
      XmlWriter::ScopedElement::writeText((ScopedElement *)local_158,&local_1a0,true);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator((allocator<char> *)(local_1b0 + 0xf));
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_158);
      std::__cxx11::string::~string(local_178);
      std::allocator<char>::~allocator(&local_179);
    }
    if ((((lock._M_device)->super___mutex_base)._M_mutex.__data.__owner & 0x20U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1d0,"ExpectedException",&local_1d1);
      XmlWriter::scopedElement((XmlWriter *)local_1b0,(string *)&this->xml);
      p_Var1 = lock._M_device[2].super___mutex_base._M_mutex.__data.__list.__prev;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,(char *)p_Var1,(allocator<char> *)(local_208 + 0xf));
      XmlWriter::ScopedElement::writeText((ScopedElement *)local_1b0,&local_1f8,true);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)(local_208 + 0xf));
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_1b0);
      std::__cxx11::string::~string(local_1d0);
      std::allocator<char>::~allocator(&local_1d1);
    }
    if ((((lock._M_device)->super___mutex_base)._M_mutex.__data.__owner & 0x40U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_228,"ExpectedExceptionString",&local_229);
      XmlWriter::scopedElement((XmlWriter *)local_208,(string *)&this->xml);
      p_Var1 = lock._M_device[2].super___mutex_base._M_mutex.__data.__list.__next;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,(char *)p_Var1,(allocator<char> *)(local_260 + 0xf));
      XmlWriter::ScopedElement::writeText((ScopedElement *)local_208,&local_250,true);
      std::__cxx11::string::~string((string *)&local_250);
      std::allocator<char>::~allocator((allocator<char> *)(local_260 + 0xf));
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_208);
      std::__cxx11::string::~string(local_228);
      std::allocator<char>::~allocator(&local_229);
    }
    if (((((lock._M_device)->super___mutex_base)._M_mutex.__data.__owner & 8U) != 0) &&
       ((lock._M_device[1].super___mutex_base._M_mutex.__size[1] & 1U) == 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_280,"Expanded",&local_281);
      XmlWriter::scopedElement((XmlWriter *)local_260,(string *)&this->xml);
      pcVar3 = String::c_str((String *)
                             &lock._M_device[1].super___mutex_base._M_mutex.__data.__list.__next);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,pcVar3,&local_2a9);
      XmlWriter::ScopedElement::writeText((ScopedElement *)local_260,&local_2a8,true);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::allocator<char>::~allocator(&local_2a9);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_260);
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator(&local_281);
    }
    log_contexts(this);
    XmlWriter::endElement(&this->xml);
    std::lock_guard<std::mutex>::~lock_guard(&local_20);
  }
  return;
}

Assistant:

void log_assert(const AssertData& rb) override {
            if(!rb.m_failed && !opt.success)
                return;

            std::lock_guard<std::mutex> lock(mutex);

            xml.startElement("Expression")
                    .writeAttribute("success", !rb.m_failed)
                    .writeAttribute("type", assertString(rb.m_at))
                    .writeAttribute("filename", skipPathFromFilename(rb.m_file))
                    .writeAttribute("line", line(rb.m_line));

            xml.scopedElement("Original").writeText(rb.m_expr);

            if(rb.m_threw)
                xml.scopedElement("Exception").writeText(rb.m_exception.c_str());

            if(rb.m_at & assertType::is_throws_as)
                xml.scopedElement("ExpectedException").writeText(rb.m_exception_type);
            if(rb.m_at & assertType::is_throws_with)
                xml.scopedElement("ExpectedExceptionString").writeText(rb.m_exception_string);
            if((rb.m_at & assertType::is_normal) && !rb.m_threw)
                xml.scopedElement("Expanded").writeText(rb.m_decomp.c_str());

            log_contexts();

            xml.endElement();
        }